

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_between_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundBetweenExpression::Copy(BoundBetweenExpression *this)

{
  pointer pEVar1;
  pointer this_00;
  Expression *in_RSI;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::BoundBetweenExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_28;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_18;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 1));
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_18,pEVar1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&in_RSI[1].super_BaseExpression.type);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_20,pEVar1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&in_RSI[1].super_BaseExpression.alias);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_28,pEVar1);
  make_uniq<duckdb::BoundBetweenExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool_const&,bool_const&>
            ((duckdb *)&local_30,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_18,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_28,(bool *)&in_RSI[1].super_BaseExpression.alias._M_string_length,
             (bool *)((long)&in_RSI[1].super_BaseExpression.alias._M_string_length + 1));
  if (local_28._M_head_impl != (Expression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_00 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                          *)&local_30);
  Expression::CopyProperties(&this_00->super_Expression,in_RSI);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundBetweenExpression::Copy() const {
	auto copy = make_uniq<BoundBetweenExpression>(input->Copy(), lower->Copy(), upper->Copy(), lower_inclusive,
	                                              upper_inclusive);
	copy->CopyProperties(*this);
	return std::move(copy);
}